

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O2

void __thiscall SQLite::Statement::Statement(Statement *this,Statement *aStatement)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  
  std::__cxx11::string::string((string *)this,(string *)aStatement);
  peVar2 = (aStatement->mpPreparedStatement).
           super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this->mpSQLite = aStatement->mpSQLite;
  (this->mpPreparedStatement).super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar2;
  (this->mpPreparedStatement).super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (aStatement->mpPreparedStatement).
           super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (aStatement->mpPreparedStatement).super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->mpPreparedStatement).super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  (aStatement->mpPreparedStatement).super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  this->mColumnCount = aStatement->mColumnCount;
  this->mbHasRow = aStatement->mbHasRow;
  this->mbDone = aStatement->mbDone;
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->mColumnNames)._M_t._M_impl.super__Rb_tree_header,
             &(aStatement->mColumnNames)._M_t._M_impl.super__Rb_tree_header);
  aStatement->mpSQLite = (sqlite3 *)0x0;
  aStatement->mColumnCount = 0;
  aStatement->mbHasRow = false;
  aStatement->mbDone = false;
  return;
}

Assistant:

Statement::Statement(Statement&& aStatement) noexcept :
    mQuery(std::move(aStatement.mQuery)),
    mpSQLite(aStatement.mpSQLite),
    mpPreparedStatement(std::move(aStatement.mpPreparedStatement)),
    mColumnCount(aStatement.mColumnCount),
    mbHasRow(aStatement.mbHasRow),
    mbDone(aStatement.mbDone),
    mColumnNames(std::move(aStatement.mColumnNames))
{
    aStatement.mpSQLite = nullptr;
    aStatement.mColumnCount = 0;
    aStatement.mbHasRow = false;
    aStatement.mbDone = false;
}